

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O3

string * __thiscall
glcts::ArraysOfArrays::ExpressionsLength1<glcts::ArraysOfArrays::Interface::GL>::
prepare_compute_shader
          (string *__return_storage_ptr__,
          ExpressionsLength1<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type,string *tested_declaration,string *tested_snippet)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (tested_shader_type == COMPUTE_SHADER_TYPE) {
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,0x1ad18c8);
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)(tested_declaration->_M_dataplus)._M_p);
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)(tested_snippet->_M_dataplus)._M_p);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ExpressionsLength1<API>::prepare_compute_shader(
	typename TestCaseBase<API>::TestShaderType tested_shader_type, const std::string& tested_declaration,
	const std::string& tested_snippet)
{
	std::string compute_shader_source;

	if (TestCaseBase<API>::COMPUTE_SHADER_TYPE == tested_shader_type)
	{
		compute_shader_source = "writeonly uniform image2D uni_image;\n"
								"\n"
								"void main()\n"
								"{\n"
								"    float result = 1u;\n"
								"\n";
		compute_shader_source += tested_declaration;
		compute_shader_source += tested_snippet;
		compute_shader_source += "\n"
								 "    imageStore(uni_image, ivec2(gl_GlobalInvocationID.xy), vec4(result, 0, 0, 0));\n"
								 "}\n"
								 "\n";
	}

	return compute_shader_source;
}